

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_tree_nodes.h
# Opt level: O1

cs_iterator
st_tree::detail::
node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>
::_cs_iterator(node_type *n)

{
  cs_iterator j;
  node_type *pnVar1;
  cs_iterator cVar2;
  exception *peVar3;
  pair<std::_Rb_tree_iterator<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*>,_std::_Rb_tree_iterator<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*>_>
  pVar4;
  undefined1 local_38 [32];
  
  if ((n->
      super_node_base<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*,_st_tree::detail::ptr_less_data<std::less<int>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*>_>_>
      )._parent == (node_type *)0x0) {
    peVar3 = (exception *)__cxa_allocate_exception(0x28);
    local_38._0_8_ = local_38 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_38,"_cs_iterator(): node has no parent","");
    exception::exception(peVar3,(string *)local_38);
    *(undefined ***)peVar3 = &PTR__exception_0030dfb0;
    __cxa_throw(peVar3,&parent_exception::typeinfo,exception::~exception);
  }
  pnVar1 = node_base<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*,_st_tree::detail::ptr_less_data<std::less<int>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*>_>_>
           ::parent(&n->
                     super_node_base<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*,_st_tree::detail::ptr_less_data<std::less<int>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*>_>_>
                   );
  local_38._0_8_ = n;
  pVar4 = std::
          _Rb_tree<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*,_st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*,_std::_Identity<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*>,_st_tree::detail::ptr_less_data<std::less<int>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*>_>
          ::equal_range(&(pnVar1->
                         super_node_base<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*,_st_tree::detail::ptr_less_data<std::less<int>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*>_>_>
                         )._children._M_t,(key_type *)local_38);
  cVar2._M_node = (_Base_ptr)pVar4.first._M_node;
  if (cVar2._M_node == pVar4.second._M_node._M_node) {
    peVar3 = (exception *)__cxa_allocate_exception(0x28);
    local_38._0_8_ = local_38 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_38,"_cs_iterator(): requested node does not exist","");
    exception::exception(peVar3,(string *)local_38);
    *(undefined ***)peVar3 = &PTR__exception_0030e0f0;
    __cxa_throw(peVar3,&missing_exception::typeinfo,exception::~exception);
  }
  do {
    if (*(node_type **)(cVar2._M_node + 1) == n) {
      return (cs_iterator)cVar2._M_node;
    }
    cVar2._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar2._M_node);
  } while (cVar2._M_node != pVar4.second._M_node._M_node);
  peVar3 = (exception *)__cxa_allocate_exception(0x28);
  local_38._0_8_ = local_38 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_38,"_cs_iterator(): requested node does not exist","");
  exception::exception(peVar3,(string *)local_38);
  *(undefined ***)peVar3 = &PTR__exception_0030e0f0;
  __cxa_throw(peVar3,&missing_exception::typeinfo,exception::~exception);
}

Assistant:

bool is_root() const { return NULL == _parent; }